

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumberObject.cpp
# Opt level: O3

void __thiscall
Js::JavascriptNumberObject::JavascriptNumberObject
          (JavascriptNumberObject *this,Var value,DynamicType *type)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  
  DynamicObject::DynamicObject(&this->super_DynamicObject,type,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_0152ce00;
  Memory::Recycler::WBSetBit((char *)&this->value);
  (this->value).ptr = value;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->value);
  if ((type->super_Type).typeId != TypeIds_NumberObject) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumberObject.cpp"
                                ,0x12,"(type->GetTypeId() == TypeIds_NumberObject)",
                                "type->GetTypeId() == TypeIds_NumberObject");
    if (!bVar2) goto LAB_00cdde1a;
    *puVar3 = 0;
  }
  if (((ulong)value & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)value & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)value & 0xffff000000000000) == 0x1000000000000) {
      return;
    }
    if ((ulong)value >> 0x32 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumberObject.cpp"
                                  ,0x13,"(TaggedInt::Is(value) || JavascriptNumber::Is(value))",
                                  "TaggedInt::Is(value) || JavascriptNumber::Is(value)");
      if (!bVar2) goto LAB_00cdde1a;
      *puVar3 = 0;
    }
    bVar2 = ThreadContext::IsOnStack(value);
    if (!bVar2) {
      return;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumberObject.cpp"
    ;
    error = "(TaggedInt::Is(value) || !ThreadContext::IsOnStack(value))";
    message = "TaggedInt::Is(value) || !ThreadContext::IsOnStack(value)";
    lineNumber = 0x14;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00cdde1a;
    *puVar3 = 0;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar3 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
  }
  bVar2 = Throw::ReportAssert(fileName,lineNumber,error,message);
  if (bVar2) {
    *puVar3 = 0;
    return;
  }
LAB_00cdde1a:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

JavascriptNumberObject::JavascriptNumberObject(Var value, DynamicType * type)
        : DynamicObject(type), value(value)
    {
        Assert(type->GetTypeId() == TypeIds_NumberObject);
        Assert(TaggedInt::Is(value) || JavascriptNumber::Is(value));
        Assert(TaggedInt::Is(value) || !ThreadContext::IsOnStack(value));
    }